

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O2

void __thiscall
YAML::detail::node_data::convert_sequence_to_map(node_data *this,shared_memory_holder *pMemory)

{
  pointer ppnVar1;
  pointer ppnVar2;
  node *this_00;
  ulong uVar3;
  stringstream stream;
  string sStack_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  reset_map(this);
  uVar3 = 0;
  while( true ) {
    ppnVar1 = (this->m_sequence).
              super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppnVar2 = (this->m_sequence).
              super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppnVar2 - (long)ppnVar1 >> 3) <= uVar3) break;
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    this_00 = memory_holder::create_node
                        ((pMemory->
                         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
    std::__cxx11::stringbuf::str();
    detail::node::set_scalar(this_00,&sStack_1d8);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    insert_map_pair(this,this_00,
                    (this->m_sequence).
                    super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar3]);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    uVar3 = uVar3 + 1;
  }
  if (ppnVar2 != ppnVar1) {
    (this->m_sequence).
    super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppnVar1;
  }
  this->m_seqSize = 0;
  this->m_type = Map;
  return;
}

Assistant:

void node_data::convert_sequence_to_map(const shared_memory_holder& pMemory) {
  assert(m_type == NodeType::Sequence);

  reset_map();
  for (std::size_t i = 0; i < m_sequence.size(); i++) {
    std::stringstream stream;
    stream << i;

    node& key = pMemory->create_node();
    key.set_scalar(stream.str());
    insert_map_pair(key, *m_sequence[i]);
  }

  reset_sequence();
  m_type = NodeType::Map;
}